

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::TiXmlDeclaration
          (TiXmlDeclaration *this,char *_version,char *_encoding,char *_standalone)

{
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,DECLARATION);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDeclaration_0019c630;
  (this->version).rep_ = (Rep *)TiXmlString::nullrep_;
  (this->encoding).rep_ = (Rep *)TiXmlString::nullrep_;
  (this->standalone).rep_ = (Rep *)TiXmlString::nullrep_;
  TiXmlString::operator=(&this->version,_version);
  TiXmlString::operator=(&this->encoding,_encoding);
  TiXmlString::operator=(&this->standalone,_standalone);
  return;
}

Assistant:

TiXmlDeclaration::TiXmlDeclaration(const char * _version,
	const char * _encoding, const char * _standalone) :
	TiXmlNode(TiXmlNode::DECLARATION) {
	version = _version;
	encoding = _encoding;
	standalone = _standalone;
}